

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

ObjectPair __thiscall arangodb::velocypack::ObjectIterator::operator*(ObjectIterator *this)

{
  long lVar1;
  ObjectPair OVar2;
  ValueLength VVar3;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this_00;
  long in_RDI;
  Slice key;
  Slice key_1;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffb0;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffb8;
  Slice *this_01;
  Slice local_20 [2];
  Slice local_10;
  Slice local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthKeyUntranslated
              (in_stack_ffffffffffffffb8,(ValueLength)in_stack_ffffffffffffffb0);
    local_10 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                         (in_stack_ffffffffffffffb8);
    this_01 = &local_8;
    this_00 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
              SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::begin
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         0x10fe03);
    VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize(this_00);
    Slice::Slice(this_01,(uint8_t *)(this_00 + VVar3));
  }
  else {
    Slice::Slice(local_20,*(uint8_t **)(in_RDI + 8));
    local_10 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                         (in_stack_ffffffffffffffb8);
    lVar1 = *(long *)(in_RDI + 8);
    VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      (in_stack_ffffffffffffffb0);
    Slice::Slice(&local_8,(uint8_t *)(lVar1 + VVar3));
  }
  OVar2.value._start = local_8._start;
  OVar2.key._start = local_10._start;
  return OVar2;
}

Assistant:

[[nodiscard]] ObjectPair operator*() const {
    if (_current != nullptr) {
      Slice key{_current};
      return {key.makeKey(), Slice(_current + key.byteSize())};
    }
    // intentionally no out-of-bounds checking here,
    // as it will be performed by Slice::getNthOffset()
    Slice key{_slice.getNthKeyUntranslated(_position)};
    return {key.makeKey(), Slice(key.begin() + key.byteSize())};
  }